

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventdispatcher_glib.cpp
# Opt level: O0

bool __thiscall
QEventDispatcherGlib::processEvents(QEventDispatcherGlib *this,ProcessEventsFlags flags)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  QEventDispatcherGlibPrivate *pQVar4;
  Int in_ESI;
  long in_FS_OFFSET;
  bool result;
  bool canWait;
  QEventDispatcherGlibPrivate *d;
  ProcessEventsFlags savedFlags;
  ProcessEventsFlag in_stack_ffffffffffffffbc;
  undefined6 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc6;
  undefined1 in_stack_ffffffffffffffc7;
  QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4> local_14;
  Int local_10;
  Int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_ESI;
  pQVar4 = d_func((QEventDispatcherGlib *)0x8cf6fe);
  bVar1 = QFlags<QEventLoop::ProcessEventsFlag>::testAnyFlag
                    ((QFlags<QEventLoop::ProcessEventsFlag> *)
                     CONCAT17(in_stack_ffffffffffffffc7,
                              CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)),
                     in_stack_ffffffffffffffbc);
  if (bVar1) {
    QAbstractEventDispatcher::aboutToBlock((QAbstractEventDispatcher *)0x8cf729);
  }
  else {
    QAbstractEventDispatcher::awake((QAbstractEventDispatcher *)0x8cf735);
  }
  local_10 = (pQVar4->timerSource->processEventsFlags).
             super_QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>.
             super_QFlagsStorage<QEventLoop::ProcessEventsFlag>.i;
  (pQVar4->timerSource->processEventsFlags).
  super_QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>.
  super_QFlagsStorage<QEventLoop::ProcessEventsFlag>.i = local_c;
  local_14.super_QFlagsStorage<QEventLoop::ProcessEventsFlag>.i =
       (QFlagsStorage<QEventLoop::ProcessEventsFlag>)
       QFlags<QEventLoop::ProcessEventsFlag>::operator&
                 ((QFlags<QEventLoop::ProcessEventsFlag> *)
                  CONCAT17(in_stack_ffffffffffffffc7,
                           CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)),
                  in_stack_ffffffffffffffbc);
  bVar2 = ::QFlags::operator_cast_to_bool((QFlags *)&local_14);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    pQVar4->timerSource->runWithIdlePriority = false;
  }
  iVar3 = g_main_context_iteration(pQVar4->mainContext,bVar1);
  while( true ) {
    bVar2 = false;
    if (iVar3 == 0) {
      bVar2 = bVar1;
    }
    if (bVar2 == false) break;
    iVar3 = g_main_context_iteration(pQVar4->mainContext,bVar1);
  }
  (pQVar4->timerSource->processEventsFlags).
  super_QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>.
  super_QFlagsStorage<QEventLoop::ProcessEventsFlag>.i = local_10;
  if (bVar1) {
    QAbstractEventDispatcher::awake((QAbstractEventDispatcher *)0x8cf837);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return iVar3 != 0;
}

Assistant:

bool QEventDispatcherGlib::processEvents(QEventLoop::ProcessEventsFlags flags)
{
    Q_D(QEventDispatcherGlib);

    const bool canWait = flags.testAnyFlag(QEventLoop::WaitForMoreEvents);
    if (canWait)
        emit aboutToBlock();
    else
        emit awake();

    // tell postEventSourcePrepare() and timerSource about any new flags
    QEventLoop::ProcessEventsFlags savedFlags = d->timerSource->processEventsFlags;
    d->timerSource->processEventsFlags = flags;

    if (!(flags & QEventLoop::EventLoopExec)) {
        // force timers to be sent at normal priority
        d->timerSource->runWithIdlePriority = false;
    }

    bool result = g_main_context_iteration(d->mainContext, canWait);
    while (!result && canWait)
        result = g_main_context_iteration(d->mainContext, canWait);

    d->timerSource->processEventsFlags = savedFlags;

    if (canWait)
        emit awake();

    return result;
}